

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDComponentFilter::AcceptVertex(ON_SubDComponentFilter *this,ON_SubDVertex *v)

{
  bool bVar1;
  ON_SubDVertex *v_local;
  ON_SubDComponentFilter *this_local;
  
  if ((this->m_bRejectVertices & 1U) == 0) {
    if (v == (ON_SubDVertex *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = AcceptVertexTag(this,v->m_vertex_tag);
      if (bVar1) {
        if (this->m_vertex_topology_filter != Unset) {
          bVar1 = ON_SubDVertex::HasBoundaryVertexTopology(v);
          if (bVar1) {
            if ((this->m_vertex_topology_filter & Boundary) == Unset) {
              return false;
            }
          }
          else {
            bVar1 = ON_SubDVertex::HasInteriorVertexTopology(v);
            if (bVar1) {
              if ((this->m_vertex_topology_filter & Interior) == Unset) {
                return false;
              }
            }
            else if ((this->m_vertex_topology_filter & Nonmanifold) == Unset) {
              return false;
            }
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDComponentFilter::AcceptVertex(const ON_SubDVertex * v) const
{
  if (m_bRejectVertices)
    return false;

  if (nullptr == v)
    return false;

  if (false == AcceptVertexTag(v->m_vertex_tag))
    return false;

  if (ON_SubDComponentFilter::Topology::Unset != m_vertex_topology_filter)
  {
    // check boundary/interior/nonmanifold
    if (v->HasBoundaryVertexTopology())
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Boundary)& static_cast<unsigned char>(m_vertex_topology_filter)))
        return false;
    }
    else if (v->HasInteriorVertexTopology())
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Interior)& static_cast<unsigned char>(m_vertex_topology_filter)))
        return false;
    }
    else
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Nonmanifold)& static_cast<unsigned char>(m_vertex_topology_filter)))
        return false;
    }
  }

  return true;
}